

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<int,unsigned_long,std::__cxx11::string,int,int>
               (ostream *out,char *fmt,int *args,unsigned_long *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,int *args_3
               ,int *args_4)

{
  int *in_RCX;
  int *in_RSI;
  FormatListRef in_RDI;
  unsigned_long *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  ostream local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = local_90;
  makeFormatList<int,unsigned_long,std::__cxx11::string,int,int>
            (in_RCX,in_R8,in_R9,(int *)out_00,in_RSI);
  vformat(out_00,(char *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}